

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessKill(pid_t process_id)

{
  int iVar1;
  int local_14f8;
  pid_t local_14f4;
  int ppid_1;
  int pid_1;
  FILE *ps;
  char *pcStack_14e0;
  int ppid;
  char *rparen;
  size_t nread;
  FILE *f;
  stat_conflict finfo;
  dirent *pdStack_1430;
  int pid;
  dirent *d;
  char buffer [1025];
  char local_1018 [8];
  char fname [4096];
  DIR *procdir;
  pid_t process_id_local;
  
  kill(process_id,0x13);
  fname._4088_8_ = opendir("/proc");
  if ((DIR *)fname._4088_8_ == (DIR *)0x0) {
    _ppid_1 = popen("ps axo pid,ppid","r");
    if ((_ppid_1 != (FILE *)0x0) && (iVar1 = __isoc99_fscanf(_ppid_1,"%*[^\n]\n"), iVar1 != -1)) {
      while (iVar1 = __isoc99_fscanf(_ppid_1,"%d %d\n",&local_14f4,&local_14f8), iVar1 == 2) {
        if (local_14f8 == process_id) {
          kwsysProcessKill(local_14f4);
        }
      }
    }
    if (_ppid_1 != (FILE *)0x0) {
      pclose(_ppid_1);
    }
  }
  else {
    pdStack_1430 = readdir((DIR *)fname._4088_8_);
    while (pdStack_1430 != (dirent *)0x0) {
      iVar1 = __isoc99_sscanf(pdStack_1430->d_name,"%d",
                              (undefined1 *)((long)finfo.__glibc_reserved + 0x14));
      if ((iVar1 == 1) && (finfo.__glibc_reserved[2]._4_4_ != 0)) {
        snprintf(local_1018,0x1000,"/proc/%d/stat",(ulong)finfo.__glibc_reserved[2]._4_4_);
        iVar1 = stat(local_1018,(stat *)&f);
        if ((iVar1 == 0) && (nread = (size_t)fopen(local_1018,"r"), (FILE *)nread != (FILE *)0x0)) {
          rparen = (char *)fread(&d,1,0x400,(FILE *)nread);
          fclose((FILE *)nread);
          *(char *)((long)&d + (long)rparen) = '\0';
          if ((((rparen != (char *)0x0) &&
               (pcStack_14e0 = strrchr((char *)&d,0x29), pcStack_14e0 != (char *)0x0)) &&
              (iVar1 = __isoc99_sscanf(pcStack_14e0 + 1,"%*s %d",(long)&ps + 4), iVar1 == 1)) &&
             (ps._4_4_ == process_id)) {
            kwsysProcessKill(finfo.__glibc_reserved[2]._4_4_);
          }
        }
      }
      pdStack_1430 = readdir((DIR *)fname._4088_8_);
    }
    closedir((DIR *)fname._4088_8_);
  }
  kill(process_id,9);
  return;
}

Assistant:

static void kwsysProcessKill(pid_t process_id)
{
#if defined(__linux__) || defined(__CYGWIN__)
  DIR* procdir;
#endif

  /* Suspend the process to be sure it will not create more children.  */
  kill(process_id, SIGSTOP);

#if defined(__CYGWIN__)
  /* Some Cygwin versions seem to need help here.  Give up our time slice
     so that the child can process SIGSTOP before we send SIGKILL.  */
  usleep(1);
#endif

/* Kill all children if we can find them.  */
#if defined(__linux__) || defined(__CYGWIN__)
  /* First try using the /proc filesystem.  */
  if ((procdir = opendir("/proc")) != NULL) {
#  if defined(MAXPATHLEN)
    char fname[MAXPATHLEN];
#  elif defined(PATH_MAX)
    char fname[PATH_MAX];
#  else
    char fname[4096];
#  endif
    char buffer[KWSYSPE_PIPE_BUFFER_SIZE + 1];
    struct dirent* d;

    /* Each process has a directory in /proc whose name is the pid.
       Within this directory is a file called stat that has the
       following format:

         pid (command line) status ppid ...

       We want to get the ppid for all processes.  Those that have
       process_id as their parent should be recursively killed.  */
    for (d = readdir(procdir); d; d = readdir(procdir)) {
      int pid;
      if (sscanf(d->d_name, "%d", &pid) == 1 && pid != 0) {
        struct stat finfo;
        snprintf(fname, sizeof(fname), "/proc/%d/stat", pid);
        if (stat(fname, &finfo) == 0) {
          FILE* f = fopen(fname, "r");
          if (f) {
            size_t nread = fread(buffer, 1, KWSYSPE_PIPE_BUFFER_SIZE, f);
            fclose(f);
            buffer[nread] = '\0';
            if (nread > 0) {
              const char* rparen = strrchr(buffer, ')');
              int ppid;
              if (rparen && (sscanf(rparen + 1, "%*s %d", &ppid) == 1)) {
                if (ppid == process_id) {
                  /* Recursively kill this child and its children.  */
                  kwsysProcessKill(pid);
                }
              }
            }
          }
        }
      }
    }
    closedir(procdir);
  } else
#endif
  {
#if defined(KWSYSPE_PS_COMMAND)
    /* Try running "ps" to get the process information.  */
    FILE* ps = popen(KWSYSPE_PS_COMMAND, "r");

    /* Make sure the process started and provided a valid header.  */
    if (ps && fscanf(ps, "%*[^\n]\n") != EOF) {
      /* Look for processes whose parent is the process being killed.  */
      int pid;
      int ppid;
      while (fscanf(ps, KWSYSPE_PS_FORMAT, &pid, &ppid) == 2) {
        if (ppid == process_id) {
          /* Recursively kill this child and its children.  */
          kwsysProcessKill(pid);
        }
      }
    }

    /* We are done with the ps process.  */
    if (ps) {
      pclose(ps);
    }
#endif
  }

  /* Kill the process.  */
  kill(process_id, SIGKILL);

#if defined(__APPLE__)
  /* On OS X 10.3 the above SIGSTOP occasionally prevents the SIGKILL
     from working.  Just in case, we resume the child and kill it
     again.  There is a small race condition in this obscure case.  If
     the child manages to fork again between these two signals, we
     will not catch its children.  */
  kill(process_id, SIGCONT);
  kill(process_id, SIGKILL);
#endif
}